

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generate.c
# Opt level: O3

void prepare_next_level(player *p)

{
  ushort uVar1;
  player_upkeep *ppVar2;
  connector *pcVar3;
  object **ppoVar4;
  loc grid;
  _Bool _Var5;
  short sVar6;
  int iVar7;
  char *pcVar8;
  object *obj;
  chunk_conflict *pcVar9;
  level_conflict *plVar10;
  chunk_conflict2 *pcVar11;
  loc_conflict lVar12;
  loc lVar13;
  square *psVar14;
  chunk_conflict *pcVar15;
  int iVar16;
  int iVar17;
  wchar_t width;
  char cVar18;
  int y;
  wchar_t height;
  ulong uVar19;
  artifact *artifact;
  int iVar20;
  int x;
  int iVar21;
  chunk *c;
  bool bVar22;
  wchar_t wVar23;
  wchar_t wVar24;
  uint uVar25;
  uint uVar26;
  char new_name [80];
  char prev_name [80];
  int local_120;
  int local_11c;
  char local_d8 [80];
  char local_88 [88];
  
  cVar18 = '\x01';
  if ((p->opts).opt[0x2a] == false) {
    cVar18 = p->upkeep->arena_level;
  }
  pcVar8 = level_name(world->levels + p->last_place);
  my_strcpy(local_88,pcVar8,0x50);
  pcVar8 = level_name(world->levels + p->place);
  my_strcpy(local_d8,pcVar8,0x50);
  pcVar9 = cave;
  if (character_dungeon == true) {
    pcVar11 = p->cave;
    if (pcVar11 == (chunk_conflict2 *)0x0) {
      __assert_fail("p->cave",
                    "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/generate.c"
                    ,0x6a4,"void prepare_next_level(struct player *)");
    }
    if (cVar18 == '\0') {
      if (cave->depth == 0) {
        pcVar9 = chunk_find_name(local_88);
        if (pcVar9 == (chunk_conflict *)0x0) {
          cave_store((chunk *)cave,local_88,false,false);
        }
        if (cave == (chunk_conflict *)0x0) goto LAB_0015f7ee;
        pcVar11 = p->cave;
        c = (chunk *)cave;
        if (pcVar11 != (chunk_conflict2 *)0x0) goto LAB_0015f5dd;
      }
      else {
LAB_0015f5dd:
        c = (chunk *)cave;
        iVar7 = cave->height;
        if (0 < iVar7) {
          iVar20 = cave->width;
          iVar16 = 0;
          do {
            if (0 < iVar20) {
              iVar7 = 0;
              do {
                lVar13 = (loc)loc(iVar7,iVar16);
                for (obj = square_object((chunk_conflict *)c,lVar13); obj != (object *)0x0;
                    obj = obj->next) {
                  if (obj->artifact != (artifact *)0x0) {
                    _Var5 = obj_is_known_artifact(obj);
                    artifact = obj->artifact;
                    if (((p->opts).opt[0x23] != false) || (_Var5)) {
                      history_lose_artifact(p,artifact);
                      artifact = obj->artifact;
                      _Var5 = true;
                    }
                    else {
                      _Var5 = false;
                    }
                    mark_artifact_created(artifact,_Var5);
                  }
                }
                iVar7 = iVar7 + 1;
                iVar20 = ((chunk_conflict *)c)->width;
              } while (iVar7 < iVar20);
              iVar7 = ((chunk_conflict *)c)->height;
            }
            iVar16 = iVar16 + 1;
          } while (iVar16 < iVar7);
          pcVar11 = p->cave;
        }
        cave_free((chunk_conflict *)pcVar11);
        p->cave = (chunk_conflict2 *)0x0;
      }
      wipe_mon_list(c,p);
      p->num_traps = '\0';
      cave_free((chunk_conflict *)c);
      cave = (chunk_conflict *)0x0;
      goto LAB_0015f7ee;
    }
    if ((cave->name == (char *)0x0) || (iVar7 = strcmp(cave->name,"arena"), iVar7 != 0)) {
      compact_monsters((chunk *)pcVar9,L'\0');
      if (p->upkeep->arena_level == false) {
        lVar13.x = (p->grid).x;
        lVar13.y = (p->grid).y;
        square_set_mon(cave,lVar13,L'\0');
      }
      cave_store((chunk *)cave,local_88,false,true);
      cave_store((chunk *)p->cave,local_88,true,true);
    }
    else if (p->place == 0) {
      p->upkeep->arena_level = false;
      sVar6 = p->last_place;
      cVar18 = '\x01';
      if (sVar6 == 0) {
        sVar6 = p->home;
        p->last_place = sVar6;
        cVar18 = (p->opts).opt[0x2a];
      }
      player_change_place(p,(int)sVar6);
      ppVar2 = p->upkeep;
      ppVar2->arena_level = true;
      ppVar2->health_who = (monster *)0x0;
      pcVar8 = level_name(world->levels + p->last_place);
      my_strcpy(local_88,pcVar8,0x50);
      pcVar8 = level_name(world->levels + p->place);
      my_strcpy(local_d8,pcVar8,0x50);
      goto LAB_0015f7a5;
    }
LAB_0015f7aa:
    pcVar9 = chunk_find_name(local_d8);
    if ((pcVar9 != (chunk_conflict *)0x0) && (pcVar9 != cave)) {
      if (cave->name == (char *)0x0) {
        bVar22 = false;
      }
      else {
        iVar7 = strcmp(cave->name,"arena");
        bVar22 = iVar7 == 0;
      }
      pcVar8 = format("%s known");
      pcVar8 = string_make(pcVar8);
      pcVar11 = (chunk_conflict2 *)chunk_find_name(pcVar8);
      if (pcVar11 == (chunk_conflict2 *)0x0) {
        __assert_fail("old_known",
                      "/workspace/llm4binary/github/license_c_cmakelists/NickMcConnell[P]FAangband/src/generate.c"
                      ,0x6df,"void prepare_next_level(struct player *)");
      }
      cave = pcVar9;
      p->cave = pcVar11;
      uVar1 = pcVar11->obj_max;
      if ((ulong)uVar1 != 0) {
        ppoVar4 = pcVar9->objects;
        uVar19 = 0;
        do {
          if ((ppoVar4[uVar19] != (object *)0x0) && (pcVar11->objects[uVar19] != (object *)0x0)) {
            ppoVar4[uVar19]->known = pcVar11->objects[uVar19];
          }
          uVar19 = uVar19 + 1;
        } while (uVar1 != uVar19);
      }
      restore_monsters();
      pcVar9 = cave;
      if (bVar22) {
        lVar12 = loc(0,0);
        _Var5 = loc_eq(p->old_grid,lVar12);
        if (_Var5) {
          if (0 < cave->height) {
            iVar7 = 0;
            pcVar15 = cave;
            do {
              if (0 < pcVar15->width) {
                iVar20 = 0;
                do {
                  lVar13 = (loc)loc(iVar20,iVar7);
                  psVar14 = square(cave,lVar13);
                  if (psVar14->mon == -1) goto LAB_0015faa8;
                  iVar20 = iVar20 + 1;
                  pcVar15 = cave;
                } while (iVar20 < cave->width);
              }
              iVar7 = iVar7 + 1;
            } while (iVar7 < pcVar15->height);
          }
          iVar7 = pcVar9->monsters[1].grid.x;
          iVar20 = pcVar9->monsters[1].grid.y;
          local_11c = iVar20 + 2;
          iVar16 = 1;
          local_120 = 3;
          do {
            y = iVar20 - iVar16;
            if (y <= iVar20 + iVar16) {
              iVar17 = iVar7 - iVar16;
              do {
                iVar21 = local_120;
                x = iVar17;
                if (iVar17 <= iVar7 + iVar16) {
                  do {
                    lVar13 = (loc)loc(x,y);
                    _Var5 = square_in_bounds_fully(pcVar9,lVar13);
                    if (((_Var5) && (_Var5 = square_isempty(pcVar9,lVar13), _Var5)) &&
                       (_Var5 = square_isvault(pcVar9,lVar13), !_Var5)) goto LAB_0015faa8;
                    iVar21 = iVar21 + -1;
                    x = x + 1;
                  } while (iVar21 != 0);
                }
                y = y + 1;
              } while (y != local_11c);
            }
            iVar16 = iVar16 + 1;
            local_11c = local_11c + 1;
            local_120 = local_120 + 2;
          } while (iVar16 != 10);
          p->grid = pcVar9->monsters[1].grid;
          sanitize_player_loc((chunk *)pcVar9,p);
        }
        else {
          p->grid = p->old_grid;
          lVar12 = loc(0,0);
          p->old_grid = lVar12;
        }
        goto LAB_0015fab1;
      }
      sanitize_player_loc((chunk *)cave,p);
      player_place((chunk_conflict2 *)cave,p,p->grid);
      goto LAB_0015fac2;
    }
    if (p->upkeep->arena_level == true) {
      height = L'\x06';
      width = L'\x06';
    }
    else {
      plVar10 = level_by_name(world,world->levels[p->place].up);
      width = L'\0';
      height = L'\0';
      if (plVar10 != (level_conflict *)0x0) {
        pcVar8 = level_name(plVar10);
        pcVar9 = chunk_find_name(pcVar8);
        if (pcVar9 == (chunk_conflict *)0x0) {
          width = L'\0';
          height = L'\0';
        }
        else {
          width = L'\0';
          height = L'\0';
          for (pcVar3 = pcVar9->join; pcVar3 != (connector *)0x0; pcVar3 = pcVar3->next) {
            if (FEAT_MORE == (uint)pcVar3->feat) {
              wVar23 = (pcVar3->grid).x + L'\x02';
              wVar24 = (pcVar3->grid).y + L'\x02';
              uVar25 = -(uint)(wVar23 < width);
              uVar26 = -(uint)(wVar24 < height);
              width = width & uVar25 | ~uVar25 & wVar23;
              height = height & uVar26 | ~uVar26 & wVar24;
            }
          }
        }
      }
      plVar10 = level_by_name(world,world->levels[p->place].down);
      if (plVar10 != (level_conflict *)0x0) {
        pcVar8 = level_name(plVar10);
        pcVar9 = chunk_find_name(pcVar8);
        if (pcVar9 != (chunk_conflict *)0x0) {
          for (pcVar3 = pcVar9->join; pcVar3 != (connector *)0x0; pcVar3 = pcVar3->next) {
            if (FEAT_LESS == (uint)pcVar3->feat) {
              wVar23 = (pcVar3->grid).x + L'\x02';
              wVar24 = (pcVar3->grid).y + L'\x02';
              uVar25 = -(uint)(wVar23 < width);
              uVar26 = -(uint)(wVar24 < height);
              width = width & uVar25 | ~uVar25 & wVar23;
              height = height & uVar26 | ~uVar26 & wVar24;
            }
          }
        }
      }
    }
  }
  else {
LAB_0015f7a5:
    if (cVar18 != '\0') goto LAB_0015f7aa;
LAB_0015f7ee:
    height = L'\0';
    width = L'\0';
  }
  cave = (chunk_conflict *)cave_generate(p,height,width);
  event_signal_flag(EVENT_GEN_LEVEL_END,true);
LAB_0015fbaa:
  if (((p->depth == 0) || (p->place == 0)) && (cave_known(p), p->place == 0)) {
    wiz_light((chunk *)cave,p,true);
  }
  else {
    pcVar9 = cave;
    _Var5 = is_daytime();
    cave_illuminate((chunk *)pcVar9,_Var5);
  }
  character_dungeon = true;
  return;
LAB_0015faa8:
  (p->grid).x = lVar13.x;
  (p->grid).y = lVar13.y;
LAB_0015fab1:
  grid.x = (p->grid).x;
  grid.y = (p->grid).y;
  square_set_mon(pcVar9,grid,L'\xffffffff');
LAB_0015fac2:
  chunk_list_remove(local_d8);
  chunk_list_remove(pcVar8);
  string_free(pcVar8);
  goto LAB_0015fbaa;
}

Assistant:

void prepare_next_level(struct player *p)
{
	bool persist = OPT(p, birth_levels_persist) || p->upkeep->arena_level;
	char prev_name[80];
	char new_name[80];

	my_strcpy(prev_name, level_name(&world->levels[p->last_place]),
			  sizeof(prev_name));
	my_strcpy(new_name, level_name(&world->levels[p->place]), sizeof(new_name));

	/* Deal with any existing current level */
	if (character_dungeon) {
		assert (p->cave);

		if (persist) {
			/* Arenas don't get stored */
			if (!cave->name || !streq(cave->name, "arena")) {
				/* Tidy up */
				compact_monsters(cave, 0);
				if (!p->upkeep->arena_level) {
					/* Leave the player marker if going to an arena */
					square_set_mon(cave, p->grid, 0);
				}

				/* Save level and known level */
				cave_store(cave, prev_name, false, true);
				cave_store(p->cave, prev_name, true, true);
			} else if (!p->place) {
				/* Paranoia - try to catch unusual exits from Arena.  Ideally
				 * unusual exits never happen and this code is unnecessary */
				p->upkeep->arena_level = false;
				if (!p->last_place) {
					p->last_place = p->home; /* paranoia */
					persist = OPT(p, birth_levels_persist);
				}
				player_change_place(p, p->last_place);
				p->upkeep->arena_level = true;

				/* Suppress "defeated" message for unusual exit */
				p->upkeep->health_who = NULL;
				my_strcpy(prev_name, level_name(&world->levels[p->last_place]),
				  sizeof(prev_name));
				my_strcpy(new_name, level_name(&world->levels[p->place]),
						  sizeof(new_name));
			}
		} else {
			/* Save the town */
			if (!cave->depth && !chunk_find_name(prev_name)) {
				cave_store(cave, prev_name, false, false);
			}

			/* Forget knowledge of old level */
			if (cave) {
				cave_clear(cave, p);
				cave = NULL;
			}
		}
	}

	/* Prepare the new level */
	if (persist) {
		/* Persistent levels need careful work */
		struct chunk *old_level = chunk_find_name(new_name);

		/* Check all the possibilities */
		if (old_level && (old_level != cave)) {
			/* We found an old level, load the known level and assign */
			int i;
			bool arena = cave->name && streq(cave->name, "arena");
			char *known_name = string_make(format("%s known", new_name));
			struct chunk *old_known = chunk_find_name(known_name);
			assert(old_known);

			/* Assign the new ones */
			cave = old_level;
			p->cave = old_known;

			/* Associate known objects */
			for (i = 0; i < p->cave->obj_max; i++) {
				if (cave->objects[i] && p->cave->objects[i]) {
					cave->objects[i]->known = p->cave->objects[i];
				}
			}

			/* Allow monsters to recover */
			restore_monsters();

			/* Leaving arenas requires special treatment */
			if (arena) {
				leave_arena(cave, p);
			} else {
				/* Map boundary changes may not cooperate with level teleport */
				sanitize_player_loc(cave, p);

				/* Place the player */
				player_place(cave, p, p->grid);
			}

			/* Remove from the list */
			chunk_list_remove(new_name);
			chunk_list_remove(known_name);
			string_free(known_name);
		} else if (p->upkeep->arena_level) {
			/* We're creating a new arena level */
			cave = cave_generate(p, 6, 6);
			event_signal_flag(EVENT_GEN_LEVEL_END, true);
		} else {
			/* Creating a new level, make sure it joins existing ones right */
			struct level *lev;
			int min_height = 0, min_width = 0;

			/* Check level above */
			lev = level_by_name(world, world->levels[p->place].up);
			if (lev) {
				struct chunk *check = chunk_find_name(level_name(lev));
				if (check) {
					get_min_level_size(check, &min_height, &min_width, true);
				}
			}

			/* Check level below */
			lev = level_by_name(world, world->levels[p->place].down);
			if (lev) {
				struct chunk *check = chunk_find_name(level_name(lev));
				if (check) {
					get_min_level_size(check, &min_height, &min_width, false);
				}
			}

			/* Generate a new level */
			cave = cave_generate(p, min_height, min_width);
			event_signal_flag(EVENT_GEN_LEVEL_END, true);
		}
	} else {
		/* Just generate a new level */
		cave = cave_generate(p, 0, 0);
		event_signal_flag(EVENT_GEN_LEVEL_END, true);
	}

	/* Know the town */
	if ((!(p->depth)) || (!(p->place))) {
		cave_known(p);
	}

	/* Apply illumination */
	if (p->place) cave_illuminate(cave, is_daytime());
	else wiz_light(cave, p, true);

	/* The dungeon is ready */
	character_dungeon = true;
}